

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void prvTidyAdjustTags(TidyDocImpl *doc)

{
  Dict *pDVar1;
  TidyTagImpl *tags;
  Dict *np;
  TidyDocImpl *doc_local;
  
  pDVar1 = prvTidyLookupTagDef(TidyTag_A);
  if (pDVar1 != (Dict *)0x0) {
    pDVar1->parser = prvTidyParseInline;
    pDVar1->model = 0x10;
  }
  pDVar1 = prvTidyLookupTagDef(TidyTag_CAPTION);
  if (pDVar1 != (Dict *)0x0) {
    pDVar1->parser = prvTidyParseInline;
  }
  pDVar1 = prvTidyLookupTagDef(TidyTag_OBJECT);
  if (pDVar1 != (Dict *)0x0) {
    pDVar1->model = pDVar1->model | 4;
  }
  pDVar1 = prvTidyLookupTagDef(TidyTag_BUTTON);
  if (pDVar1 != (Dict *)0x0) {
    pDVar1->parser = prvTidyParseBlock;
  }
  tagsEmptyHash(doc,&doc->tags);
  doc->HTML5Mode = no;
  return;
}

Assistant:

void TY_(AdjustTags)( TidyDocImpl *doc )
{
    Dict *np = (Dict *)TY_(LookupTagDef)( TidyTag_A );
    TidyTagImpl* tags = &doc->tags;
    if (np) 
    {
        np->parser = TY_(ParseInline);
        np->model  = CM_INLINE;
    }

/*\
 * Issue #196
 * TidyTag_CAPTION allows %flow; in HTML5,
 * but only %inline; in HTML4
\*/
    np = (Dict *)TY_(LookupTagDef)( TidyTag_CAPTION );
    if (np)
    {
        np->parser = TY_(ParseInline);
    }

/*\
 * Issue #232
 * TidyTag_OBJECT not in head in HTML5,
 * but still allowed in HTML4
\*/
    np = (Dict *)TY_(LookupTagDef)( TidyTag_OBJECT );
    if (np)
    {
        np->model |= CM_HEAD; /* add back allowed in head */
    }

/*\
 * Issue #461
 * TidyTag_BUTTON is a block in HTML4,
 * whereas it is inline in HTML5
\*/
    np = (Dict *)TY_(LookupTagDef)(TidyTag_BUTTON);
    if (np)
    {
        np->parser = TY_(ParseBlock);
    }

    tagsEmptyHash(doc, tags); /* not sure this is really required, but to be sure */
    doc->HTML5Mode = no;   /* set *NOT* HTML5 mode */

}